

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::cache_flushed_alert::~cache_flushed_alert(cache_flushed_alert *this)

{
  cache_flushed_alert *this_local;
  
  ~cache_flushed_alert(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

struct TORRENT_EXPORT cache_flushed_alert final : torrent_alert
	{
		// internal
		cache_flushed_alert(aux::stack_allocator& alloc, torrent_handle const& h);

		TORRENT_DEFINE_ALERT_PRIO(cache_flushed_alert, 58, alert_priority_high)

		static constexpr alert_category_t static_category = alert_category::storage;
	}